

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O0

void __thiscall
SuiteTimeRangeTests::TestisInRangeWithDay_SameDay::RunImpl(TestisInRangeWithDay_SameDay *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_d0;
  TimeRange local_b0 [8];
  TimeRange timeRange;
  undefined1 local_70 [8];
  UtcTimeStamp now;
  int endDay;
  int startDay;
  undefined1 local_40 [8];
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  TestisInRangeWithDay_SameDay *this_local;
  
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endTime.super_DateTime.m_time,3,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)local_40,0x12,0,0,0);
  now.super_DateTime.m_time._4_4_ = 2;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_70,2,0,0,0x1c,7,0x7d4);
  FIX::TimeRange::TimeRange
            (local_b0,(UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,
             now.super_DateTime.m_time._4_4_);
  bVar1 = FIX::TimeRange::isInRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,
                     now.super_DateTime.m_time._4_4_,(DateTime *)local_70);
  bVar1 = UnitTest::Check<bool>(bVar1);
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_d0,*ppTVar3,0x95);
    UnitTest::TestResults::OnTestFailure
              (this_00,&local_d0,"TimeRange::isInRange(startTime, endTime, startDay, endDay, now)");
  }
  FIX::TimeRange::~TimeRange(local_b0);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_70);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_40);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endTime.super_DateTime.m_time);
  return;
}

Assistant:

TEST(isInRangeWithDay_SameDay)
{
  UtcTimeOnly startTime( 3, 0, 0 );
  UtcTimeOnly endTime( 18, 0, 0 );
  int startDay = 2;
  int endDay = 2;

  UtcTimeStamp now( 2, 0, 0, 28, 7, 2004 );
  TimeRange timeRange(startTime, endTime, startDay, endDay);
  CHECK(TimeRange::isInRange(startTime, endTime, startDay, endDay, now));
}